

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall despot::VNode::PrintTree(VNode *this,int depth,ostream *os)

{
  pointer ppQVar1;
  double dVar2;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *pmVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  VNode *pVVar7;
  _Self __tmp;
  ulong uVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> labels;
  allocator<char> local_c9;
  QNode *local_c8;
  VNode *local_c0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  ostream *local_a0;
  ulong local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if (this->depth_ <= depth || depth == -1) {
    local_c0 = this;
    if (this->depth_ == 0) {
      poVar4 = std::operator<<(os,"d - default value");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"l - lower bound");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"u - upper bound");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"r - totol weighted one step reward");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"w - total particle weight");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    poVar4 = std::operator<<(os,"(");
    std::operator<<(poVar4,"d:");
    pVVar7 = local_c0;
    poVar4 = std::ostream::_M_insert<double>((local_c0->default_move_).value);
    std::operator<<(poVar4," l:");
    poVar4 = std::ostream::_M_insert<double>(pVVar7->lower_bound_);
    std::operator<<(poVar4,", u:");
    poVar4 = std::ostream::_M_insert<double>(pVVar7->upper_bound_);
    std::operator<<(poVar4,", w:");
    dVar2 = State::Weight(&pVVar7->particles_);
    poVar4 = std::ostream::_M_insert<double>(dVar2);
    std::operator<<(poVar4,", weu:");
    dVar2 = DESPOT::WEU(pVVar7);
    poVar4 = std::ostream::_M_insert<double>(dVar2);
    poVar4 = std::operator<<(poVar4,")");
    std::endl<char,std::char_traits<char>>(poVar4);
    local_a0 = os;
    for (local_98 = 0;
        ppQVar1 = (local_c0->children_).
                  super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        local_98 <
        (ulong)((long)(local_c0->children_).
                      super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppQVar1 >> 3);
        local_98 = local_98 + 1) {
      local_c8 = ppQVar1[local_98];
      local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pmVar3 = &local_c8->children_;
      for (p_Var5 = (local_c8->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,
                   (value_type_conflict2 *)(p_Var5 + 1));
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"|   ",&local_c9);
      repeat(&local_70,&local_50,local_c0->depth_);
      poVar4 = local_a0;
      poVar6 = std::operator<<(local_a0,(string *)&local_70);
      poVar6 = std::operator<<(poVar6,"a=");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_c8->edge_);
      poVar6 = std::operator<<(poVar6,": ");
      std::operator<<(poVar6,"(d:");
      poVar6 = std::ostream::_M_insert<double>(local_c8->default_value);
      std::operator<<(poVar6,", l:");
      poVar6 = std::ostream::_M_insert<double>(local_c8->lower_bound_);
      std::operator<<(poVar6,", u:");
      poVar6 = std::ostream::_M_insert<double>(local_c8->upper_bound_);
      std::operator<<(poVar6,", r:");
      poVar6 = std::ostream::_M_insert<double>(local_c8->step_reward);
      poVar6 = std::operator<<(poVar6,")");
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      for (uVar8 = 0;
          uVar8 < (ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar8 = uVar8 + 1) {
        if ((depth == -1) || (local_c0->depth_ < depth)) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"|   ",&local_c9);
          repeat(&local_70,&local_90,local_c0->depth_);
          poVar6 = std::operator<<(poVar4,(string *)&local_70);
          poVar6 = std::operator<<(poVar6,"| o=");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::operator<<(poVar6,": ");
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          pVVar7 = QNode::Child(local_c8,local_b8._M_impl.super__Vector_impl_data._M_start[uVar8]);
          PrintTree(pVVar7,depth,poVar4);
        }
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_b8);
    }
  }
  return;
}

Assistant:

void VNode::PrintTree(int depth, ostream& os) {
	if (depth != -1 && this->depth() > depth)
		return;

	if (this->depth() == 0) {
		os << "d - default value" << endl
			<< "l - lower bound" << endl
			<< "u - upper bound" << endl
			<< "r - totol weighted one step reward" << endl
			<< "w - total particle weight" << endl;
	}

	os << "(" << "d:" << this->default_move().value <<
		" l:" << this->lower_bound() << ", u:" << this->upper_bound()
		<< ", w:" << this->Weight() << ", weu:" << DESPOT::WEU(this)
		<< ")"
		<< endl;


	vector<QNode*>& qnodes = children();
	for (int a = 0; a < qnodes.size(); a++) {
		QNode* qnode = qnodes[a];

		vector<OBS_TYPE> labels;
		map<OBS_TYPE, VNode*>& vnodes = qnode->children();
		for (map<OBS_TYPE, VNode*>::iterator it = vnodes.begin();
			it != vnodes.end(); it++) {
			labels.push_back(it->first);
		}

		os << repeat("|   ", this->depth()) << "a="
			<< qnode->edge() << ": "
			<< "(d:" << qnode->default_value << ", l:" << qnode->lower_bound()
			<< ", u:" << qnode->upper_bound()
			<< ", r:" << qnode->step_reward << ")" << endl;

		for (int i = 0; i < labels.size(); i++) {
			if (depth == -1 || this->depth() + 1 <= depth) {
				os << repeat("|   ", this->depth()) << "| o=" << labels[i]
					<< ": ";
				qnode->Child(labels[i])->PrintTree(depth, os);
			}
		}
	}
}